

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O0

void bcwrite_kgc(BCWriteCtx *ctx,GCproto *pt)

{
  short sVar1;
  uint uVar2;
  uint uVar3;
  GCtab *t;
  char *pcVar4;
  cTValue *q;
  char *pcStack_70;
  CTypeID id;
  char *p;
  MSize need;
  MSize tp;
  GCobj *o;
  GCRef *kr;
  MSize sizekgc;
  MSize i;
  GCproto *pt_local;
  BCWriteCtx *ctx_local;
  char *local_10;
  
  uVar2 = pt->sizekgc;
  o = (GCobj *)((pt->k).ptr64 + (ulong)uVar2 * -8);
  kr._4_4_ = 0;
  do {
    if (uVar2 <= kr._4_4_) {
      return;
    }
    t = *(GCtab **)o;
    p._0_4_ = 1;
    if (t->gct == '\x04') {
      p._4_4_ = *(int *)((long)&(t->array).ptr64 + 4) + 5;
      p._0_4_ = *(int *)((long)&(t->array).ptr64 + 4) + 5;
    }
    else if (t->gct == '\a') {
      p._4_4_ = 0;
    }
    else if (t->gct == '\n') {
      sVar1._0_1_ = t->nomm;
      sVar1._1_1_ = t->colo;
      p._0_4_ = 0x15;
      if (sVar1 == 0xb) {
        p._4_4_ = 2;
      }
      else if (sVar1 == 0xc) {
        p._4_4_ = 3;
      }
      else {
        p._4_4_ = 4;
      }
    }
    else {
      p._4_4_ = 1;
      p._0_4_ = 0xb;
    }
    if ((uint)((int)(ctx->sb).e - (int)(ctx->sb).w) < (uint)p) {
      local_10 = lj_buf_more2(&ctx->sb,(uint)p);
    }
    else {
      local_10 = (ctx->sb).w;
    }
    pcStack_70 = lj_strfmt_wuleb128(local_10,p._4_4_);
    if (p._4_4_ < 5) {
      if (p._4_4_ != 1) {
        if (p._4_4_ != 0) {
          pcVar4 = lj_strfmt_wuleb128(pcStack_70,(uint32_t)(t->array).ptr64);
          pcStack_70 = lj_strfmt_wuleb128(pcVar4,*(uint32_t *)((long)&(t->array).ptr64 + 4));
          if (p._4_4_ == 4) {
            pcVar4 = lj_strfmt_wuleb128(pcStack_70,(uint32_t)(t->gclist).gcptr64);
            pcStack_70 = lj_strfmt_wuleb128(pcVar4,*(uint32_t *)((long)&(t->gclist).gcptr64 + 4));
          }
        }
        goto LAB_0013dcae;
      }
      bcwrite_ktab(ctx,pcStack_70,t);
    }
    else {
      uVar3 = *(uint *)((long)&(t->array).ptr64 + 4);
      memcpy(pcStack_70,&t->gclist,(ulong)uVar3);
      pcStack_70 = pcStack_70 + uVar3;
LAB_0013dcae:
      (ctx->sb).w = pcStack_70;
    }
    kr._4_4_ = kr._4_4_ + 1;
    o = (GCobj *)&(o->gch).marked;
  } while( true );
}

Assistant:

static void bcwrite_kgc(BCWriteCtx *ctx, GCproto *pt)
{
  MSize i, sizekgc = pt->sizekgc;
  GCRef *kr = mref(pt->k, GCRef) - (ptrdiff_t)sizekgc;
  for (i = 0; i < sizekgc; i++, kr++) {
    GCobj *o = gcref(*kr);
    MSize tp, need = 1;
    char *p;
    /* Determine constant type and needed size. */
    if (o->gch.gct == ~LJ_TSTR) {
      tp = BCDUMP_KGC_STR + gco2str(o)->len;
      need = 5+gco2str(o)->len;
    } else if (o->gch.gct == ~LJ_TPROTO) {
      lj_assertBCW((pt->flags & PROTO_CHILD), "prototype has unexpected child");
      tp = BCDUMP_KGC_CHILD;
#if LJ_HASFFI
    } else if (o->gch.gct == ~LJ_TCDATA) {
      CTypeID id = gco2cd(o)->ctypeid;
      need = 1+4*5;
      if (id == CTID_INT64) {
	tp = BCDUMP_KGC_I64;
      } else if (id == CTID_UINT64) {
	tp = BCDUMP_KGC_U64;
      } else {
	lj_assertBCW(id == CTID_COMPLEX_DOUBLE,
		     "bad cdata constant CTID %d", id);
	tp = BCDUMP_KGC_COMPLEX;
      }
#endif
    } else {
      lj_assertBCW(o->gch.gct == ~LJ_TTAB,
		   "bad constant GC type %d", o->gch.gct);
      tp = BCDUMP_KGC_TAB;
      need = 1+2*5;
    }
    /* Write constant type. */
    p = lj_buf_more(&ctx->sb, need);
    p = lj_strfmt_wuleb128(p, tp);
    /* Write constant data (if any). */
    if (tp >= BCDUMP_KGC_STR) {
      p = lj_buf_wmem(p, strdata(gco2str(o)), gco2str(o)->len);
    } else if (tp == BCDUMP_KGC_TAB) {
      bcwrite_ktab(ctx, p, gco2tab(o));
      continue;
#if LJ_HASFFI
    } else if (tp != BCDUMP_KGC_CHILD) {
      cTValue *q = (TValue *)cdataptr(gco2cd(o));
      p = lj_strfmt_wuleb128(p, q[0].u32.lo);
      p = lj_strfmt_wuleb128(p, q[0].u32.hi);
      if (tp == BCDUMP_KGC_COMPLEX) {
	p = lj_strfmt_wuleb128(p, q[1].u32.lo);
	p = lj_strfmt_wuleb128(p, q[1].u32.hi);
      }
#endif
    }
    ctx->sb.w = p;
  }
}